

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_get_rotation_tov3(vector3 *from,vector3 *to,quaternion *qR)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  
  dVar9 = (to->field_0).v[0];
  dVar10 = (from->field_0).v[0];
  dVar3 = (from->field_0).v[1];
  dVar4 = (from->field_0).v[2];
  dVar5 = (to->field_0).v[1];
  dVar6 = (to->field_0).v[2];
  auVar7._0_8_ = dVar6 * dVar3 - dVar4 * dVar5;
  auVar7._8_8_ = dVar9 * dVar4 - dVar10 * dVar6;
  auVar8._0_8_ = dVar10 * dVar5 - dVar9 * dVar3;
  dVar9 = dVar6 * dVar4 + dVar10 * dVar9 + dVar3 * dVar5;
  *(undefined1 (*) [16])&qR->field_0 = auVar7;
  (qR->field_0).q[2] = auVar8._0_8_;
  dVar10 = dVar9 * dVar9 +
           auVar8._0_8_ * auVar8._0_8_ + auVar7._0_8_ * auVar7._0_8_ + auVar7._8_8_ * auVar7._8_8_;
  (qR->field_0).q[3] = dVar9 + dVar10;
  if (1e-05 <= dVar10) {
    auVar1._8_8_ = dVar10;
    auVar1._0_8_ = dVar10;
    auVar7 = divpd(auVar7,auVar1);
    *(undefined1 (*) [16])&qR->field_0 = auVar7;
    auVar8._8_8_ = dVar9 + dVar10;
    auVar2._8_8_ = dVar10;
    auVar2._0_8_ = dVar10;
    auVar7 = divpd(auVar8,auVar2);
    *(undefined1 (*) [16])((long)&qR->field_0 + 0x10) = auVar7;
  }
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_get_rotation_tov3(const struct vector3 *from, const struct vector3 *to, struct quaternion *qR)
{
	/* this code avoids sqrt and cos and sin and would be nice to
	 * avoid division
	 */
	struct vector3 w;
	HYP_FLOAT dot;
	HYP_FLOAT norm;

	vector3_cross_product(&w, from, to);
	dot = vector3_dot_product(from, to);

	qR->x = w.x;
	qR->y = w.y;
	qR->z = w.z;
	qR->w = dot;

	norm = quaternion_norm(qR);
	qR->w += norm;

	/* normalization with avoidance of div/0 and reusing the norm */
	/* (already calculated above) */
	if (!scalar_equalsf(norm, 0.0f)) {
		qR->x /= norm;
		qR->y /= norm;
		qR->z /= norm;
		qR->w /= norm;
	}

	return qR;
}